

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Shape.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Shape_Material(X3DImporter *this)

{
  FIReader *pFVar1;
  CX3DImporter_NodeElement *pParentElement;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  CX3DImporter_NodeElement_Material *this_00;
  aiColor3D *pValue;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *this_01;
  uint pAttrIdx;
  string *psVar5;
  allocator local_d9;
  CX3DImporter_NodeElement *ne;
  float local_cc;
  float local_c8;
  float local_c4;
  aiColor3D local_c0;
  aiColor3D local_b0;
  aiColor3D local_a0;
  string def;
  string use;
  string an;
  
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  local_b0.r = 0.0;
  local_b0.g = 0.0;
  pAttrIdx = 0;
  local_b0.b = 0.0;
  use.field_2._M_local_buf[0] = '\0';
  local_c0.r = 0.0;
  local_c0.g = 0.0;
  def.field_2._M_local_buf[0] = '\0';
  local_c0.b = 0.0;
  ne = (CX3DImporter_NodeElement *)0x0;
  local_a0.r = 0.8;
  local_a0.g = 0.8;
  local_a0.b = 0.8;
  uVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  local_cc = 0.0;
  local_c8 = 0.2;
  local_c4 = 0.2;
  do {
    if (uVar3 == pAttrIdx) {
      if (use._M_string_length == 0) {
        this_00 = (CX3DImporter_NodeElement_Material *)operator_new(0x80);
        CX3DImporter_NodeElement_Material::CX3DImporter_NodeElement_Material
                  (this_00,this->NodeElement_Cur);
        ne = (CX3DImporter_NodeElement *)this_00;
        if (def._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&(this_00->super_CX3DImporter_NodeElement).ID);
        }
        *(float *)&ne[1]._vptr_CX3DImporter_NodeElement = local_c4;
        *(float *)((long)&ne[1].ID._M_string_length + 4) = local_c8;
        *(float *)((long)&ne[1].ID.field_2 + 0xc) = local_cc;
        *(ai_real *)((long)&ne[1]._vptr_CX3DImporter_NodeElement + 4) = local_a0.r;
        ne[1].Type = (EType)local_a0.g;
        *(ai_real *)&ne[1].field_0xc = local_a0.b;
        *(ai_real *)&ne[1].ID._M_dataplus._M_p = local_b0.r;
        *(ulong *)((long)&ne[1].ID._M_dataplus._M_p + 4) = CONCAT44(local_b0.b,local_b0.g);
        ne[1].ID.field_2._M_allocated_capacity = local_c0._0_8_;
        *(ai_real *)((long)&ne[1].ID.field_2 + 8) = local_c0.b;
        iVar4 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
        pParentElement = ne;
        if ((char)iVar4 == '\0') {
          std::__cxx11::string::string((string *)&an,"Material",&local_d9);
          ParseNode_Metadata(this,pParentElement,&an);
          std::__cxx11::string::~string((string *)&an);
        }
        else {
          std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::push_back
                    (&this->NodeElement_Cur->Child,&ne);
        }
        this_01 = &this->NodeElement_List;
      }
      else {
        XML_CheckNode_MustBeEmpty(this);
        if (def._M_string_length != 0) {
          Throw_DEF_And_USE(this);
        }
        bVar2 = FindNodeElement(this,&use,ENET_Material,&ne);
        if (!bVar2) {
          Throw_USE_NotFound(this,&use);
        }
        this_01 = &this->NodeElement_Cur->Child;
      }
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(this_01,&ne);
      std::__cxx11::string::~string((string *)&def);
      std::__cxx11::string::~string((string *)&use);
      return;
    }
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)pAttrIdx);
    std::__cxx11::string::string((string *)&an,(char *)CONCAT44(extraout_var,iVar4),&local_d9);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)pAttrIdx);
      psVar5 = &def;
LAB_005337a2:
      std::__cxx11::string::assign((char *)psVar5);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)pAttrIdx);
        psVar5 = &use;
        goto LAB_005337a2;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (!bVar2) {
        bVar2 = std::operator==(&an,"bboxSize");
        if (!bVar2) {
          bVar2 = std::operator==(&an,"containerField");
          if (!bVar2) {
            bVar2 = std::operator==(&an,"ambientIntensity");
            if (bVar2) {
              local_c4 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
            }
            else {
              bVar2 = std::operator==(&an,"shininess");
              if (bVar2) {
                local_c8 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
              }
              else {
                bVar2 = std::operator==(&an,"transparency");
                if (bVar2) {
                  local_cc = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                }
                else {
                  bVar2 = std::operator==(&an,"diffuseColor");
                  pValue = &local_a0;
                  if (!bVar2) {
                    bVar2 = std::operator==(&an,"emissiveColor");
                    pValue = &local_b0;
                    if (!bVar2) {
                      bVar2 = std::operator==(&an,"specularColor");
                      pValue = &local_c0;
                      if (!bVar2) {
                        Throw_IncorrectAttr(this,&an);
                        goto LAB_005337aa;
                      }
                    }
                  }
                  XML_ReadNode_GetAttrVal_AsCol3f(this,pAttrIdx,pValue);
                }
              }
            }
          }
        }
      }
    }
LAB_005337aa:
    std::__cxx11::string::~string((string *)&an);
    pAttrIdx = pAttrIdx + 1;
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Shape_Material()
{
    std::string use, def;
    float ambientIntensity = 0.2f;
    float shininess = 0.2f;
    float transparency = 0;
    aiColor3D diffuseColor(0.8f, 0.8f, 0.8f);
    aiColor3D emissiveColor(0, 0, 0);
    aiColor3D specularColor(0, 0, 0);
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ambientIntensity", ambientIntensity, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("shininess", shininess, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("transparency", transparency, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("diffuseColor", diffuseColor, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_REF("emissiveColor", emissiveColor, XML_ReadNode_GetAttrVal_AsCol3f);
		MACRO_ATTRREAD_CHECK_REF("specularColor", specularColor, XML_ReadNode_GetAttrVal_AsCol3f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Material, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Material(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_Material*)ne)->AmbientIntensity = ambientIntensity;
		((CX3DImporter_NodeElement_Material*)ne)->Shininess = shininess;
		((CX3DImporter_NodeElement_Material*)ne)->Transparency = transparency;
		((CX3DImporter_NodeElement_Material*)ne)->DiffuseColor = diffuseColor;
		((CX3DImporter_NodeElement_Material*)ne)->EmissiveColor = emissiveColor;
		((CX3DImporter_NodeElement_Material*)ne)->SpecularColor = specularColor;
        // check for child nodes
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Material");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}